

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O0

void __thiscall
lf::uscalfe::
MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionAT<double>,_lf::base::PredicateTrue>::
MassEdgeMatrixProvider
          (MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionAT<double>,_lf::base::PredicateTrue>
           *this,QuadRule *fe_space,QuadRule *param_3)

{
  ScalarReferenceFiniteElement<double> *fe_00;
  RefElType RVar1;
  RefElType RVar2;
  element_type *this_00;
  QuadRule local_5c8;
  PrecomputedScalarReferenceFiniteElement<double> local_598;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  stringstream local_440 [8];
  stringstream ss_1;
  ostream local_430 [381];
  RefEl local_2b3;
  RefEl local_2b2;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [399];
  RefElType local_31;
  ScalarReferenceFiniteElement<double> *local_30;
  ScalarReferenceFiniteElement<double> *fe;
  QuadRule *quadrule_local;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *fe_space_local;
  MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionAT<double>,_lf::base::PredicateTrue>
  *this_local;
  
  this->_vptr_MassEdgeMatrixProvider = (_func_int **)&PTR__MassEdgeMatrixProvider_00bdef88;
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->fe_precomp_).grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).shap_fun_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->fe_precomp_).qr_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).qr_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->fe_precomp_).qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->fe_precomp_).qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->fe_precomp_).qr_.ref_el_ = 0;
  *(undefined3 *)&(this->fe_precomp_).qr_.field_0x1 = 0;
  (this->fe_precomp_).qr_.degree_ = 0;
  (this->fe_precomp_).qr_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->fe_precomp_).super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement
       = (_func_int **)0x0;
  (this->fe_precomp_).fe_ = (ScalarReferenceFiniteElement<double> *)0x0;
  fe = (ScalarReferenceFiniteElement<double> *)param_3;
  quadrule_local = fe_space;
  fe_space_local = (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)this;
  PrecomputedScalarReferenceFiniteElement<double>::PrecomputedScalarReferenceFiniteElement
            (&this->fe_precomp_);
  this_00 = std::
            __shared_ptr_access<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)fe_space);
  local_31 = (RefElType)lf::base::RefEl::kSegment();
  local_30 = UniformScalarFESpace<double>::ShapeFunctionLayout(this_00,(RefEl)local_31);
  if (local_30 == (ScalarReferenceFiniteElement<double> *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1d0);
    std::operator<<(local_1c0,"No shape functions specified for edges");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"fe != nullptr",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_219);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1f0,&local_218,0x1ac,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"false",&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"",&local_2b1);
    lf::base::AssertionFailed(&local_260,&local_288,0x1ac,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    abort();
  }
  local_2b2 = quad::QuadRule::RefEl(param_3);
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_2b2);
  local_2b3 = lf::base::RefEl::kSegment();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_2b3);
  fe_00 = local_30;
  if (RVar1 == RVar2) {
    quad::QuadRule::QuadRule(&local_5c8,param_3);
    PrecomputedScalarReferenceFiniteElement<double>::PrecomputedScalarReferenceFiniteElement
              (&local_598,fe_00,&local_5c8);
    PrecomputedScalarReferenceFiniteElement<double>::operator=(&this->fe_precomp_,&local_598);
    PrecomputedScalarReferenceFiniteElement<double>::~PrecomputedScalarReferenceFiniteElement
              (&local_598);
    quad::QuadRule::~QuadRule(&local_5c8);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_440);
  std::operator<<(local_430,"Quadrature rule not meant for EDGE entities!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"quadrule.RefEl() == base::RefEl::kSegment()",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
             ,&local_489);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_460,&local_488,0x1ae,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"false",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
             ,&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"",&local_521);
  lf::base::AssertionFailed(&local_4d0,&local_4f8,0x1ae,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  abort();
}

Assistant:

MassEdgeMatrixProvider(
      std::shared_ptr<const UniformScalarFESpace<SCALAR>> fe_space, COEFF gamma,
      lf::quad::QuadRule quadrule,
      EDGESELECTOR edge_selector = base::PredicateTrue{})
      : gamma_(std::move(gamma)),
        edge_sel_(std::move(edge_selector)),
        fe_precomp_() {
    auto fe = fe_space->ShapeFunctionLayout(base::RefEl::kSegment());
    LF_ASSERT_MSG(fe != nullptr, "No shape functions specified for edges");
    LF_ASSERT_MSG(quadrule.RefEl() == base::RefEl::kSegment(),
                  "Quadrature rule not meant for EDGE entities!");
    // Precompute entity-independent quantities
    fe_precomp_ = PrecomputedScalarReferenceFiniteElement(fe, quadrule);
  }